

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint8_t uVar1;
  char *__s1;
  _Bool _Var2;
  int iVar3;
  uint near_lossless;
  long lVar4;
  FILE *__stream;
  size_t sVar5;
  uint8_t *triplet_buffer;
  uint *puVar6;
  void *buffer;
  charls_interleave_mode interleave_mode;
  char *pcVar7;
  uint8_t *puVar8;
  char *pcVar9;
  size_t column;
  long lVar10;
  bmp_dib_header_t dib_header;
  bmp_header_t header;
  size_t stride;
  size_t encoded_size;
  bmp_dib_header_t local_80;
  char local_58;
  char local_57;
  undefined1 local_54 [4];
  undefined1 local_50 [4];
  uint32_t local_4c;
  char *local_48;
  size_t local_40;
  size_t local_38;
  
  if (argc < 3) {
    pcVar7 = 
    "Usage: <input-filename> <output-filename> [interleave-mode (none, line or sample), default = none] [near-lossless, default=0 (lossless)]"
    ;
LAB_00104976:
    puts(pcVar7);
  }
  else {
    pcVar7 = argv[1];
    pcVar9 = argv[2];
    near_lossless = 0;
    interleave_mode = CHARLS_INTERLEAVE_MODE_NONE;
    if (argc != 3) {
      __s1 = argv[3];
      iVar3 = strcmp(__s1,"none");
      interleave_mode = CHARLS_INTERLEAVE_MODE_NONE;
      if (iVar3 != 0) {
        iVar3 = strcmp(__s1,"line");
        if (iVar3 == 0) {
          interleave_mode = CHARLS_INTERLEAVE_MODE_LINE;
        }
        else {
          iVar3 = strcmp(__s1,"sample");
          if (iVar3 != 0) {
            pcVar7 = "Argument interleave-mode needs to be: none, line or sample";
            goto LAB_00104976;
          }
          interleave_mode = CHARLS_INTERLEAVE_MODE_SAMPLE;
        }
      }
      if ((uint)argc < 5) {
        near_lossless = 0;
      }
      else {
        lVar4 = strtol(argv[4],(char **)0x0,10);
        near_lossless = (uint)lVar4;
        if (0xff < near_lossless) {
          pcVar7 = "Argument near-lossless needs to be in the range [0,255]";
          goto LAB_00104976;
        }
      }
    }
    __stream = fopen(pcVar7,"rb");
    if (__stream == (FILE *)0x0) {
      puVar6 = (uint *)__errno_location();
      printf("Failed to open file: %s, errno: %d\n",pcVar7,(ulong)*puVar6);
      return 1;
    }
    sVar5 = fread(&local_58,2,1,__stream);
    if (((((((sVar5 == 0) || (sVar5 = fread(local_54,4,1,__stream), sVar5 == 0)) ||
           (sVar5 = fread(local_50,4,1,__stream), sVar5 == 0)) ||
          ((sVar5 = fread(&local_4c,4,1,__stream), sVar5 == 0 || (local_58 != 'B')))) ||
         (((local_57 != 'M' ||
           ((sVar5 = fread(&local_80,4,1,__stream), sVar5 == 0 || (local_80.header_size < 0x28))))
          || (sVar5 = fread(&local_80.width,4,1,__stream), sVar5 == 0)))) ||
        ((((sVar5 = fread(&local_80.height,4,1,__stream), sVar5 == 0 ||
           (sVar5 = fread(&local_80.number_planes,2,1,__stream), sVar5 == 0)) ||
          (sVar5 = fread(&local_80.depth,2,1,__stream), sVar5 == 0)) ||
         (((sVar5 = fread(&local_80.compress_type,4,1,__stream), sVar5 == 0 ||
           (sVar5 = fread(&local_80.bmp_byte_size,4,1,__stream), sVar5 == 0)) ||
          ((sVar5 = fread(&local_80.horizontal_resolution,4,1,__stream), sVar5 == 0 ||
           ((sVar5 = fread(&local_80.vertical_resolution,4,1,__stream), sVar5 == 0 ||
            (sVar5 = fread(&local_80.number_colors,4,1,__stream), sVar5 == 0)))))))))) ||
       (sVar5 = fread(&local_80.number_important_colors,4,1,__stream), sVar5 == 0)) {
      printf("Failed to read the BMP info from the file: %s\n",argv[1]);
    }
    else {
      if ((local_80.compress_type == 0) && (local_80.depth == 0x18)) {
        local_48 = pcVar9;
        if ((local_80.width != 0) && (local_80.height != 0)) {
          triplet_buffer =
               (uint8_t *)bmp_read_pixel_data((FILE *)__stream,local_4c,&local_80,&local_40);
          fclose(__stream);
          if (triplet_buffer == (uint8_t *)0x0) {
            pcVar7 = argv[1];
            pcVar9 = "Failed to read the BMP pixel data from the file: %s\n";
            goto LAB_00104df8;
          }
          if ((long)local_80.height < 1) {
            local_80.height = -local_80.height;
          }
          else {
            _Var2 = convert_bottom_up_to_top_down
                              (triplet_buffer,(ulong)local_80.width,(long)local_80.height,local_40);
            if (!_Var2) {
              pcVar7 = "Failed to convert the pixels from bottom up to top down";
              goto LAB_00104976;
            }
          }
          if (local_80.height != 0) {
            puVar8 = triplet_buffer + 2;
            lVar4 = 0;
            do {
              if (local_80.width != 0) {
                lVar10 = 0;
                do {
                  uVar1 = puVar8[lVar10 + -2];
                  puVar8[lVar10 + -2] = puVar8[lVar10];
                  puVar8[lVar10] = uVar1;
                  lVar10 = lVar10 + 3;
                } while ((ulong)local_80.width * 3 != lVar10);
              }
              lVar4 = lVar4 + 1;
              puVar8 = puVar8 + local_40;
            } while (lVar4 != local_80.height);
          }
          buffer = encode_bmp_to_jpegls
                             (triplet_buffer,local_40,&local_80,interleave_mode,near_lossless,
                              &local_38);
          free(triplet_buffer);
          if (buffer == (void *)0x0) {
            return 1;
          }
          _Var2 = save_jpegls_file(local_48,buffer,local_38);
          free(buffer);
          if (_Var2) {
            return 0;
          }
          pcVar9 = "Failed to write encoded data to the file: %s\n";
          pcVar7 = local_48;
LAB_00104df8:
          printf(pcVar9,pcVar7);
          return 1;
        }
        pcVar7 = "Can only process an image that is 1 x 1 or bigger";
      }
      else {
        pcVar7 = "Can only convert uncompressed 24 bits BMP files";
      }
      printf(pcVar7);
    }
    fclose(__stream);
  }
  return 1;
}

Assistant:

int main(const int argc, char* argv[])
{
    options_t options;
    if (!parse_command_line_options(argc, argv, &options))
        return EXIT_FAILURE;

    FILE* input_stream = fopen(options.input_filename, "rb");
    if (!input_stream)
    {
        printf("Failed to open file: %s, errno: %d\n", options.input_filename, errno);
        return EXIT_FAILURE;
    }

    bmp_header_t header;
    bmp_dib_header_t dib_header;
    if (!bmp_read_header(input_stream, &header) || !bmp_read_dib_header(input_stream, &dib_header))
    {
        printf("Failed to read the BMP info from the file: %s\n", argv[1]);
        (void) fclose(input_stream);
        return EXIT_FAILURE;
    }

    if (dib_header.compress_type != 0 || dib_header.depth != 24)
    {
        printf("Can only convert uncompressed 24 bits BMP files");
        (void) fclose(input_stream);
        return EXIT_FAILURE;
    }

    if (dib_header.width == 0 || dib_header.height == 0)
    {
        printf("Can only process an image that is 1 x 1 or bigger");
        (void) fclose(input_stream);
        return EXIT_FAILURE;
    }

    size_t stride;
    void* pixel_data = bmp_read_pixel_data(input_stream, header.offset, &dib_header, &stride);
    (void ) fclose(input_stream);

    if (!pixel_data)
    {
        printf("Failed to read the BMP pixel data from the file: %s\n", argv[1]);
        return EXIT_FAILURE;
    }

    // Pixels in the BMP file format are stored bottom up (when the height parameter is positive), JPEG-LS requires top down.
    if (dib_header.height > 0)
    {
        if (!convert_bottom_up_to_top_down(pixel_data, dib_header.width, (size_t)dib_header.height, stride))
        {
            printf("Failed to convert the pixels from bottom up to top down\n");
            return EXIT_FAILURE;
        }
    }
    else
    {
        dib_header.height = abs(dib_header.height);
    }

    // Pixels in the BMP file format are stored as BGR. JPEG-LS (SPIFF header) only supports the RGB color model.
    // Note: without the optional SPIFF header no color information is stored in the JPEG-LS file and the common assumption
    // is RGB.
    convert_bgr_to_rgb(pixel_data, dib_header.width, (size_t)dib_header.height, stride);

    size_t encoded_size;
    void* encoded_data =
        encode_bmp_to_jpegls(pixel_data, stride, &dib_header, options.interleave_mode, options.near_lossless, &encoded_size);
    free(pixel_data);
    if (!encoded_data)
        return EXIT_FAILURE; // error already printed.

    const bool result = save_jpegls_file(options.output_filename, encoded_data, encoded_size);
    free(encoded_data);
    if (!result)
    {
        printf("Failed to write encoded data to the file: %s\n", options.output_filename);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}